

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O2

RK_S32 mpp_enc_refs_update_hdr(MppEncRefs refs)

{
  RK_S32 RVar1;
  
  if (refs == (MppEncRefs)0x0) {
    RVar1 = 0;
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_update_hdr");
  }
  else if (((byte)enc_refs_debug & 1) == 0) {
    RVar1 = *(RK_S32 *)((long)refs + 0x38);
  }
  else {
    _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_update_hdr",refs);
    RVar1 = *(RK_S32 *)((long)refs + 0x38);
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_update_hdr",refs);
    }
  }
  return RVar1;
}

Assistant:

RK_S32 mpp_enc_refs_update_hdr(MppEncRefs refs)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return 0;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    RK_S32 hdr_need_update = p->hdr_need_update;

    enc_refs_dbg_func("leave %p\n", refs);
    return hdr_need_update;
}